

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  bool bVar2;
  ON_BrepLoop *L;
  int lti;
  ON_Brep *this_00;
  bool bVar3;
  
  lti = 0;
  if (F->m_face_index < 0) {
    bVar3 = false;
  }
  else {
    while ((iVar1 = (F->m_li).m_count, bVar3 = lti < iVar1, lti < iVar1 &&
           ((this_00 = (ON_Brep *)F, L = ON_BrepFace::Loop(F,lti), L == (ON_BrepLoop *)0x0 ||
            (bVar2 = HasSlits(this_00,L), !bVar2))))) {
      lti = lti + 1;
    }
  }
  return bVar3;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepFace& F) const

{
  if (F.m_face_index < 0)
    return false;
  int i;
  for (i=0; i<F.m_li.Count(); i++){
    const ON_BrepLoop* pL = F.Loop(i);
    if (!pL)
      continue;
    if (HasSlits(*pL))
      return true;
  }
  return false;
}